

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O2

void dowaterdemon(void)

{
  xchar xVar1;
  int iVar2;
  monst *mtmp;
  char *pcVar3;
  trap *ptVar4;
  
  if ((mvitals[300].mvflags & 3) != 0) {
    pline("The fountain bubbles furiously for a moment, then calms.");
    return;
  }
  mtmp = makemon(mons + 300,level,(int)u.ux,(int)u.uy,0);
  if (mtmp == (monst *)0x0) {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019a649;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019a644;
LAB_0019a67d:
    pcVar3 = a_monnam(mtmp);
    pline("You unleash %s!",pcVar3);
  }
  else {
LAB_0019a644:
    if (ublindf != (obj *)0x0) {
LAB_0019a649:
      if (ublindf->oartifact == '\x1d') goto LAB_0019a67d;
    }
    pline("You feel the presence of evil.");
  }
  iVar2 = rnd(100);
  xVar1 = level_difficulty(&u.uz);
  if (xVar1 + 0x50 < iVar2) {
    iVar2 = pronoun_gender(level,mtmp);
    pcVar3 = genders[iVar2].his;
    iVar2 = pronoun_gender(level,mtmp);
    pline("Grateful for %s release, %s grants you a wish!",pcVar3,genders[iVar2].he);
    makewish('\0');
    mongone(mtmp);
    return;
  }
  ptVar4 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
  if (ptVar4 == (trap *)0x0) {
    return;
  }
  mintrap(mtmp);
  return;
}

Assistant:

static void dowaterdemon(void) /* Water demon */
{
    struct monst *mtmp;

    if (!(mvitals[PM_WATER_DEMON].mvflags & G_GONE)) {
	if ((mtmp = makemon(&mons[PM_WATER_DEMON], level, u.ux, u.uy, NO_MM_FLAGS))) {
	    if (!Blind)
		pline("You unleash %s!", a_monnam(mtmp));
	    else
		pline("You feel the presence of evil.");

	/* Give those on low levels a (slightly) better chance of survival */
	    if (rnd(100) > (80 + level_difficulty(&u.uz))) {
		pline("Grateful for %s release, %s grants you a wish!",
		      mhis(level, mtmp), mhe(level, mtmp));
		makewish(FALSE);
		mongone(mtmp);
	    } else if (t_at(level, mtmp->mx, mtmp->my))
		mintrap(mtmp);
	}
    } else
	pline("The fountain bubbles furiously for a moment, then calms.");
}